

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::DefineUncachedFunctions(ByteCodeGenerator *this,FuncInfo *funcInfoParent)

{
  ParseNodeFnc *pPVar1;
  ByteCodeGenerator *local_38;
  FuncInfo **local_30;
  FuncInfo *local_28;
  FuncInfo *funcInfoParent_local;
  
  local_30 = &local_28;
  local_38 = this;
  local_28 = funcInfoParent;
  pPVar1 = ParseNode::AsParseNodeFnc(&funcInfoParent->root->super_ParseNode);
  funcInfoParent_local = (FuncInfo *)&local_38;
  MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1133:24)>
  ::anon_class_8_1_3fcf6586::operator()
            ((anon_class_8_1_3fcf6586 *)&funcInfoParent_local,pPVar1->pnodeScopes->pnodeScopes);
  if (pPVar1->pnodeBodyScope != (ParseNodeBlock *)0x0) {
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1133:24)>
    ::anon_class_8_1_3fcf6586::operator()
              ((anon_class_8_1_3fcf6586 *)&funcInfoParent_local,pPVar1->pnodeBodyScope->pnodeScopes)
    ;
  }
  return;
}

Assistant:

void ByteCodeGenerator::DefineUncachedFunctions(FuncInfo *funcInfoParent)
{
    ParseNode *pnodeParent = funcInfoParent->root;
    auto defineCheck = [&](ParseNode *pnodeFnc)
    {
        Assert(pnodeFnc->nop == knopFncDecl);

        //
        // Don't define the function upfront in following cases
        // 1. x = function() {...};
        //    Don't define the function for all modes.
        //    Such a function can only be accessed via the LHS, so we define it at the assignment point
        //    rather than the scope entry to save a register (and possibly save the whole definition).
        //
        // 2. x = function f() {...};
        //    f is not visible in the enclosing scope.
        //    Such function expressions should be emitted only at the assignment point, as can be used only
        //    after the assignment. Might save register.
        //

        if (pnodeFnc->AsParseNodeFnc()->IsDeclaration() || pnodeFnc->AsParseNodeFnc()->IsDefaultModuleExport())
        {
            this->DefineOneFunction(pnodeFnc->AsParseNodeFnc(), funcInfoParent);
            // The "x = function() {...}" case is being generated on the fly, during emission,
            // so the caller expects to be able to release this register.
            funcInfoParent->ReleaseLoc(pnodeFnc);
            pnodeFnc->location = Js::Constants::NoRegister;
        }
    };
    MapContainerScopeFunctions(pnodeParent, defineCheck);
}